

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

InterCode * __thiscall IrSim::icBinOp(IrSim *this,int kind,C_OP *t,C_OP *a1,C_OP *a2)

{
  InterCode *in_RDI;
  InterCode *this_00;
  Operand *in_stack_ffffffffffffff30;
  Operand *in_stack_ffffffffffffff38;
  Operand *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  InterCode *in_stack_ffffffffffffff50;
  
  this_00 = in_RDI;
  Operand::Operand((Operand *)in_RDI,(Operand *)in_RDI);
  Operand::Operand((Operand *)this_00,(Operand *)in_RDI);
  Operand::Operand((Operand *)this_00,(Operand *)in_RDI);
  InterCode::InterCode
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Operand::~Operand((Operand *)0x11efd5);
  Operand::~Operand((Operand *)0x11efdf);
  Operand::~Operand((Operand *)0x11efec);
  return this_00;
}

Assistant:

InterCode icBinOp(int kind, C_OP &t, C_OP &a1, C_OP &a2) const { return InterCode(kind, t, a1, a2); }